

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O2

uint UFPC::MemMerge(uint i,uint j)

{
  int iVar1;
  pointer puVar2;
  pointer piVar3;
  uint uVar4;
  uint root;
  uint uVar5;
  
  piVar3 = mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = i;
  while( true ) {
    iVar1 = piVar3[(int)uVar5];
    piVar3[(int)uVar5] = iVar1 + 1;
    if (uVar5 <= puVar2[(int)uVar5]) break;
    piVar3[(int)uVar5] = iVar1 + 2;
    uVar5 = puVar2[(int)uVar5];
  }
  uVar4 = j;
  if (i != j) {
    while( true ) {
      iVar1 = piVar3[(int)uVar4];
      piVar3[(int)uVar4] = iVar1 + 1;
      if (uVar4 <= puVar2[(int)uVar4]) break;
      piVar3[(int)uVar4] = iVar1 + 2;
      uVar4 = puVar2[(int)uVar4];
    }
    if (uVar5 < uVar4) {
      uVar4 = uVar5;
    }
    while( true ) {
      uVar5 = uVar4;
      iVar1 = piVar3[(int)j];
      piVar3[(int)j] = iVar1 + 1;
      uVar4 = puVar2[(int)j];
      piVar3[(int)j] = iVar1 + 2;
      if (j <= uVar4) break;
      uVar4 = puVar2[(int)j];
      piVar3[(int)j] = iVar1 + 3;
      puVar2[(int)j] = uVar5;
      j = uVar4;
      uVar4 = uVar5;
    }
    puVar2[(int)j] = uVar5;
  }
  while( true ) {
    iVar1 = piVar3[(int)i];
    piVar3[(int)i] = iVar1 + 1;
    uVar4 = puVar2[(int)i];
    piVar3[(int)i] = iVar1 + 2;
    if (i <= uVar4) break;
    uVar4 = puVar2[(int)i];
    piVar3[(int)i] = iVar1 + 3;
    puVar2[(int)i] = uVar5;
    i = uVar4;
  }
  puVar2[(int)i] = uVar5;
  return uVar5;
}

Assistant:

static unsigned MemMerge(unsigned i, unsigned j)
    {
        // FindRoot(i)
        unsigned root(i);
        while (mem_P_[root] < root) {
            root = mem_P_[root];
        }
        if (i != j) {
            // FindRoot(j)
            unsigned root_j(j);
            while (mem_P_[root_j] < root_j) {
                root_j = mem_P_[root_j];
            }
            if (root > root_j) {
                root = root_j;
            }
            // SetRoot(j, root);
            while (mem_P_[j] < j) {
                unsigned t = mem_P_[j];
                mem_P_[j] = root;
                j = t;
            }
            mem_P_[j] = root;
        }
        // SetRoot(i, root);
        while (mem_P_[i] < i) {
            unsigned t = mem_P_[i];
            mem_P_[i] = root;
            i = t;
        }
        mem_P_[i] = root;
        return root;
    }